

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::SequenceRepetitionSyntax::setChild
          (SequenceRepetitionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048ebb0 + *(int *)(&DAT_0048ebb0 + index * 4)))();
  return;
}

Assistant:

void SequenceRepetitionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBracket = child.token(); return;
        case 1: op = child.token(); return;
        case 2: selector = child.node() ? &child.node()->as<SelectorSyntax>() : nullptr; return;
        case 3: closeBracket = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}